

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::add_fallback_format(SwapchainBuilder *this,VkSurfaceFormatKHR format)

{
  SwapchainBuilder *this_local;
  VkSurfaceFormatKHR format_local;
  
  this_local = (SwapchainBuilder *)format;
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::push_back
            (&(this->info).desired_formats,(value_type *)&this_local);
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::add_fallback_format(VkSurfaceFormatKHR format) {
    info.desired_formats.push_back(format);
    return *this;
}